

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O0

void * xmlMemMalloc(size_t size)

{
  undefined4 *puVar1;
  MEMHDR *p;
  size_t size_local;
  
  xmlInitParser();
  if (size < 0xfffffffffffffff0) {
    puVar1 = (undefined4 *)malloc(size + 0x10);
    if (puVar1 == (undefined4 *)0x0) {
      size_local = 0;
    }
    else {
      *puVar1 = 0x5aa5;
      *(size_t *)(puVar1 + 2) = size;
      xmlMutexLock(&xmlMemMutex);
      debugMemSize = size + debugMemSize;
      debugMemBlocks = debugMemBlocks + 1;
      xmlMutexUnlock(&xmlMemMutex);
      size_local = (size_t)(puVar1 + 4);
    }
  }
  else {
    size_local = 0;
  }
  return (void *)size_local;
}

Assistant:

void *
xmlMemMalloc(size_t size)
{
    MEMHDR *p;

    xmlInitParser();

    if (size > (MAX_SIZE_T - RESERVE_SIZE))
        return(NULL);

    p = (MEMHDR *) malloc(RESERVE_SIZE + size);
    if (!p)
        return(NULL);
    p->mh_tag = MEMTAG;
    p->mh_size = size;

    xmlMutexLock(&xmlMemMutex);
    debugMemSize += size;
    debugMemBlocks++;
    xmlMutexUnlock(&xmlMemMutex);

    return(HDR_2_CLIENT(p));
}